

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateYield(ExpressionTranslateContext *ctx,ExprYield *expression)

{
  ExprBase *expression_00;
  ExprBase *expression_01;
  char *format;
  bool bVar1;
  
  if (expression->coroutineStateUpdate != (ExprBase *)0x0) {
    Translate(ctx,expression->coroutineStateUpdate);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
  }
  expression_00 = expression->closures;
  bVar1 = true;
  if ((expression_00 != (ExprBase *)0x0) && (expression_00->typeID == 0x37)) {
    bVar1 = expression_00[1].typeID == 0;
  }
  expression_01 = expression->value;
  if (expression_01->type == ctx->ctx->typeVoid) {
    if (!bVar1) {
      Translate(ctx,expression_00);
      Print(ctx,";");
      PrintLine(ctx);
      PrintIndent(ctx);
      expression_01 = expression->value;
    }
    Translate(ctx,expression_01);
    Print(ctx,";");
    PrintLine(ctx);
    PrintIndent(ctx);
    format = "return;";
  }
  else {
    if (!bVar1) {
      Print(ctx,"__nullcReturnValue_%d = ",(ulong)ctx->nextReturnValueId);
      Translate(ctx,expression->value);
      Print(ctx,";");
      PrintLine(ctx);
      PrintIndent(ctx);
      Translate(ctx,expression->closures);
      Print(ctx,";");
      PrintLine(ctx);
      PrintIndent(ctx);
      Print(ctx,"return __nullcReturnValue_%d;",(ulong)ctx->nextReturnValueId);
      goto LAB_0013ebeb;
    }
    Print(ctx,"return ");
    Translate(ctx,expression->value);
    format = ";";
  }
  Print(ctx,format);
LAB_0013ebeb:
  PrintLine(ctx);
  ctx->currentFunction->nextTranslateRestoreBlock =
       ctx->currentFunction->nextTranslateRestoreBlock + 1;
  Print(ctx,"yield_%d:");
  return;
}

Assistant:

void TranslateYield(ExpressionTranslateContext &ctx, ExprYield *expression)
{
	if(expression->coroutineStateUpdate)
	{
		Translate(ctx, expression->coroutineStateUpdate);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);
	}

	ExprSequence *closures = getType<ExprSequence>(expression->closures);

	if(closures && closures->expressions.empty())
		closures = NULL;

	if(expression->value->type == ctx.ctx.typeVoid)
	{
		if(closures)
		{
			Translate(ctx, expression->closures);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);
		}

		Translate(ctx, expression->value);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Print(ctx, "return;");
	}
	else if(closures)
	{
		Print(ctx, "__nullcReturnValue_%d = ", ctx.nextReturnValueId);
		Translate(ctx, expression->value);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Translate(ctx, expression->closures);
		Print(ctx, ";");
		PrintLine(ctx);
		PrintIndent(ctx);

		Print(ctx, "return __nullcReturnValue_%d;", ctx.nextReturnValueId);
	}
	else
	{
		Print(ctx, "return ");
		Translate(ctx, expression->value);
		Print(ctx, ";");
	}

	PrintLine(ctx);

	Print(ctx, "yield_%d:", ctx.currentFunction->nextTranslateRestoreBlock++);
}